

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::createTriangleProgs(SourceCollections *dst)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"vert",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nvoid main (void) { gl_Position = a_position; }\n"
             ,&local_7a);
  glu::VertexSource::VertexSource((VertexSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"frag",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(location = 0) out lowp vec4 o_color;\nvoid main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n"
             ,&local_7a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void createTriangleProgs (SourceCollections& dst)
{
	dst.glslSources.add("vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"void main (void) { gl_Position = a_position; }\n");
	dst.glslSources.add("frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(location = 0) out lowp vec4 o_color;\n"
		"void main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n");
}